

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# contract_light_test.cpp
# Opt level: O1

void __thiscall
ContractTestOnClassWithInvariant_ThatACallToAFailingPreConditionFireTheSetExceptionAndThatTheInvariantWasNotCalledAndThatTheStateOfTheClassDoesNotChange_Test
::TestBody(ContractTestOnClassWithInvariant_ThatACallToAFailingPreConditionFireTheSetExceptionAndThatTheInvariantWasNotCalledAndThatTheStateOfTheClassDoesNotChange_Test
           *this)

{
  TestClassWithInvariant *this_00;
  internal iVar1;
  bool bVar2;
  char *pcVar3;
  char *in_R9;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  int oldY;
  int oldX;
  AssertHelper local_68;
  AssertHelper local_60;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_58;
  AssertHelper local_50;
  undefined1 local_48 [32];
  int local_28;
  int local_24;
  
  this_00 = &(this->super_ContractTestOnClassWithInvariant).sut;
  local_24 = (this->super_ContractTestOnClassWithInvariant).sut.x;
  local_28 = (this->super_ContractTestOnClassWithInvariant).sut.y;
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    anon_unknown.dwarf_2b38::TestClassWithInvariant::setX(this_00,0);
  }
  testing::Message::Message((Message *)local_48);
  testing::internal::AssertHelper::AssertHelper
            (&local_60,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/FelixPetriconi[P]contract_light/test/contract_light_test.cpp"
             ,0x7e,
             "Expected: sut.setX(0) throws an exception of type PreConditionFailedEx.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=(&local_60,(Message *)local_48);
  testing::internal::AssertHelper::~AssertHelper(&local_60);
  if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48._0_8_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    bVar2 = testing::internal::IsTrue(true);
    if ((bVar2) &&
       ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(long *)local_48._0_8_ + 8))();
    }
    local_48._0_8_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  }
  local_60.data_ = (AssertHelperData *)((ulong)local_60.data_._4_4_ << 0x20);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_48,"0","sut.invariantWasCalled",(int *)&local_60,
             &(this->super_ContractTestOnClassWithInvariant).sut.invariantWasCalled);
  if (local_48[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_60);
    if ((undefined8 *)local_48._8_8_ == (undefined8 *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)local_48._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/FelixPetriconi[P]contract_light/test/contract_light_test.cpp"
               ,0x80,pcVar3);
    testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_68);
    if (local_60.data_ != (AssertHelperData *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_60.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_60.data_ + 8))();
      }
      local_60.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_48 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  iVar1 = (internal)(this->super_ContractTestOnClassWithInvariant).sut.preConditionWasCalled;
  local_58.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_60.data_._0_1_ = iVar1;
  if (iVar1 == (internal)0x0) {
    testing::Message::Message((Message *)&local_68);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_48,(internal *)&local_60,
               (AssertionResult *)"sut.preConditionWasCalled","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/FelixPetriconi[P]contract_light/test/contract_light_test.cpp"
               ,0x81,(char *)local_48._0_8_);
    testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_48 + 0x10)
       ) {
      operator_delete((void *)local_48._0_8_);
    }
    if (local_68.data_ != (AssertHelperData *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_68.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_68.data_ + 8))();
      }
      local_68.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_58,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_60.data_._0_1_ =
       (internal)((this->super_ContractTestOnClassWithInvariant).sut.postConditionWasCalled == 0);
  local_58.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_60.data_._0_1_) {
    testing::Message::Message((Message *)&local_68);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_48,(internal *)&local_60,
               (AssertionResult *)"sut.postConditionWasCalled","true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/FelixPetriconi[P]contract_light/test/contract_light_test.cpp"
               ,0x82,(char *)local_48._0_8_);
    testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_48 + 0x10)
       ) {
      operator_delete((void *)local_48._0_8_);
    }
    if (local_68.data_ != (AssertHelperData *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_68.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_68.data_ + 8))();
      }
      local_68.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_58,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  testing::internal::CmpHelperEQ<int,int>((internal *)local_48,"oldX","sut.x",&local_24,&this_00->x)
  ;
  if (local_48[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_60);
    if ((undefined8 *)local_48._8_8_ == (undefined8 *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)local_48._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/FelixPetriconi[P]contract_light/test/contract_light_test.cpp"
               ,0x84,pcVar3);
    testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_68);
    if (local_60.data_ != (AssertHelperData *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_60.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_60.data_ + 8))();
      }
      local_60.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_48 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_48,"oldY","sut.y",&local_28,
             &(this->super_ContractTestOnClassWithInvariant).sut.y);
  if (local_48[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_60);
    if ((undefined8 *)local_48._8_8_ == (undefined8 *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)local_48._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/FelixPetriconi[P]contract_light/test/contract_light_test.cpp"
               ,0x85,pcVar3);
    testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_68);
    if (local_60.data_ != (AssertHelperData *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_60.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_60.data_ + 8))();
      }
      local_60.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_48 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  return;
}

Assistant:

TEST_F(ContractTestOnClassWithInvariant, ThatACallToAFailingPreConditionFireTheSetExceptionAndThatTheInvariantWasNotCalledAndThatTheStateOfTheClassDoesNotChange)
{
  auto oldX = sut.x;
  auto oldY = sut.y;
  EXPECT_THROW(sut.setX(0), PreConditionFailedEx);

  EXPECT_EQ(0, sut.invariantWasCalled);
  EXPECT_TRUE(sut.preConditionWasCalled);
  EXPECT_FALSE(sut.postConditionWasCalled);

  EXPECT_EQ(oldX, sut.x);
  EXPECT_EQ(oldY, sut.y);
}